

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::create_pipeline(InnerProduct *this,Option *opt)

{
  bool bVar1;
  long in_RSI;
  Mat *in_RDI;
  Mat int8_weight_data_n;
  Mat weight_data_n;
  Option opt_q;
  int p;
  int weight_data_size_output;
  Mat int8_weight_data;
  Option *in_stack_000007e8;
  float in_stack_000007f4;
  Mat *in_stack_000007f8;
  Mat *in_stack_00000800;
  Allocator *in_stack_fffffffffffffec8;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 uVar2;
  int local_70;
  Mat local_58;
  int local_4;
  
  if ((((*(byte *)(in_RSI + 0x1a) & 1) != 0) && (in_RDI[4].allocator == (Allocator *)0x4)) &&
     (*(int *)((long)&in_RDI[3].data + 4) != 0)) {
    this_00 = &local_58;
    Mat::Mat(in_RDI,in_stack_fffffffffffffedc,(size_t)this_00,in_stack_fffffffffffffec8);
    bVar1 = Mat::empty(this_00);
    uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
    if (bVar1) {
      local_4 = -100;
      bVar1 = true;
    }
    else {
      for (local_70 = 0; local_70 < (int)in_RDI[2].cstep; local_70 = local_70 + 1) {
        Mat::range((Mat *)CONCAT44(uVar2,in_stack_fffffffffffffed8),(int)((ulong)this_00 >> 0x20),
                   (int)this_00);
        Mat::range((Mat *)CONCAT44(uVar2,in_stack_fffffffffffffed8),(int)((ulong)this_00 >> 0x20),
                   (int)this_00);
        Mat::operator[]((Mat *)&in_RDI[6].elemsize,(long)local_70);
        quantize_float32_to_int8
                  (in_stack_00000800,in_stack_000007f8,in_stack_000007f4,in_stack_000007e8);
        Mat::~Mat((Mat *)0x14eff2);
        Mat::~Mat((Mat *)0x14effc);
      }
      Mat::operator=((Mat *)CONCAT44(uVar2,in_stack_fffffffffffffed8),this_00);
      bVar1 = false;
    }
    Mat::~Mat((Mat *)0x14f085);
    if (bVar1) {
      return local_4;
    }
  }
  return 0;
}

Assistant:

int InnerProduct::create_pipeline(const Option& opt)
{
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int p=0; p<num_output; p++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * p, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * p, weight_data_size_output);
            quantize_float32_to_int8(weight_data_n, int8_weight_data_n, weight_data_int8_scales[p], opt_q);
        }

        weight_data = int8_weight_data;
    }

    return 0;
}